

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O3

void __thiscall yactfr::internal::JsonBioValReq::JsonBioValReq(JsonBioValReq *this)

{
  _Rb_tree_header *p_Var1;
  Set *pSVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  long lVar5;
  long *plVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_8c;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_8b;
  allocator local_8a;
  allocator local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68 [16];
  long local_58 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::__cxx11::string::string((string *)&local_88,"first-to-last",&local_89);
  std::__cxx11::string::string(local_68,"last-to-first",&local_8a);
  __l._M_len = 2;
  __l._M_array = &local_88;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_48,__l,&local_8b,&local_8c);
  JsonValReq::JsonValReq
            ((JsonValReq *)this,(optional<yactfr::internal::JsonValKind>)0x500000001,false);
  (this->super_JsonStrValInSetReq).super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonScalarValInSetReq_002fb638;
  p_Var3 = &(this->super_JsonStrValInSetReq)._set._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_48._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    (this->super_JsonStrValInSetReq)._set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    pSVar2 = &(this->super_JsonStrValInSetReq)._set;
    local_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    p_Var4 = p_Var3;
  }
  else {
    p_Var1 = &local_48._M_impl.super__Rb_tree_header;
    (this->super_JsonStrValInSetReq)._set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_48._M_impl.super__Rb_tree_header._M_header._M_parent;
    (local_48._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var3;
    pSVar2 = (Set *)&local_48;
    (this->super_JsonStrValInSetReq)._set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_48._M_impl.super__Rb_tree_header._M_node_count;
    local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    p_Var3 = local_48._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var4 = local_48._M_impl.super__Rb_tree_header._M_header._M_right;
    local_48._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_48._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  (this->super_JsonStrValInSetReq)._set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       p_Var3;
  (this->super_JsonStrValInSetReq)._set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       p_Var4;
  (pSVar2->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_JsonStrValInSetReq)._set._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       local_48._M_impl.super__Rb_tree_header._M_header._M_color;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_48);
  lVar5 = -0x40;
  plVar6 = local_58;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  (this->super_JsonStrValInSetReq).super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonScalarValInSetReq_002fbbd0;
  return;
}

Assistant:

explicit JsonBioValReq() :
        JsonStrValInSetReq {JsonStrValInSetReq::Set {strs::ftl, strs::ltf}}
    {
    }